

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void parser_suite::parse_compact_array(void)

{
  undefined1 *puVar1;
  bool bVar2;
  char *pcVar3;
  uchar (*in_RDX) [5];
  uchar (*input_16) [6];
  uchar (*input_17) [8];
  uchar (*input_18) [12];
  uchar (*input_19) [8];
  uchar (*input_20) [9];
  uchar (*input_21) [11];
  uchar (*input_22) [15];
  uchar (*input_23) [14];
  uchar (*input_24) [15];
  uchar (*input_25) [17];
  uchar (*input_26) [21];
  uchar (*input_27) [26];
  uchar (*input_28) [27];
  uchar (*input_29) [29];
  uchar (*input_30) [33];
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_03;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_04;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_05;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_06;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_07;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_08;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_09;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_10;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_11;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_12;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_13;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_14;
  basic_variable<std::allocator<char>_> *local_1a38;
  basic_variable<std::allocator<char>_> *local_1a18;
  basic_variable<std::allocator<char>_> *local_19f8;
  basic_variable<std::allocator<char>_> *local_19d8;
  basic_variable<std::allocator<char>_> *local_19b8;
  basic_variable<std::allocator<char>_> *local_1998;
  basic_variable<std::allocator<char>_> *local_1978;
  basic_variable<std::allocator<char>_> *local_1958;
  basic_variable<std::allocator<char>_> *local_1938;
  basic_variable<std::allocator<char>_> *local_1918;
  basic_variable<std::allocator<char>_> *local_18f8;
  basic_variable<std::allocator<char>_> *local_18d8;
  basic_variable<std::allocator<char>_> *local_18b8;
  basic_variable<std::allocator<char>_> *local_1898;
  basic_variable<std::allocator<char>_> *local_1878;
  basic_variable<std::allocator<char>_> *local_1858;
  const_iterator local_1840;
  const_iterator local_1828;
  iterator local_1810;
  iterator local_17f8;
  basic_variable<std::allocator<char>_> *local_17e0;
  basic_variable<std::allocator<char>_> local_17d8;
  basic_variable<std::allocator<char>_> local_17a8;
  basic_variable<std::allocator<char>_> local_1778;
  undefined1 local_1748 [24];
  basic_variable<std::allocator<char>_> expected_15;
  basic_variable<std::allocator<char>_> result_15;
  value_type input_15 [33];
  const_iterator local_1698;
  iterator local_1680;
  iterator local_1668;
  basic_variable<std::allocator<char>_> *local_1650;
  basic_variable<std::allocator<char>_> local_1648;
  basic_variable<std::allocator<char>_> local_1618;
  basic_variable<std::allocator<char>_> local_15e8;
  undefined1 local_15b8 [24];
  basic_variable<std::allocator<char>_> expected_14;
  basic_variable<std::allocator<char>_> result_14;
  value_type input_14 [29];
  const_iterator local_1520;
  const_iterator local_1508;
  iterator local_14f0;
  iterator local_14d8;
  basic_variable<std::allocator<char>_> *local_14c0;
  basic_variable<std::allocator<char>_> local_14b8;
  basic_variable<std::allocator<char>_> local_1488;
  basic_variable<std::allocator<char>_> local_1458;
  undefined1 local_1428 [24];
  basic_variable<std::allocator<char>_> expected_13;
  basic_variable<std::allocator<char>_> result_13;
  value_type input_13 [27];
  const_iterator local_1390;
  const_iterator local_1378;
  iterator local_1360;
  iterator local_1348;
  basic_variable<std::allocator<char>_> *local_1330;
  basic_variable<std::allocator<char>_> local_1328;
  basic_variable<std::allocator<char>_> local_12f8;
  basic_variable<std::allocator<char>_> local_12c8;
  undefined1 local_1298 [24];
  basic_variable<std::allocator<char>_> expected_12;
  basic_variable<std::allocator<char>_> result_12;
  value_type input_12 [26];
  const_iterator local_1200;
  const_iterator local_11e8;
  iterator local_11d0;
  iterator local_11b8;
  basic_variable<std::allocator<char>_> *local_11a0;
  basic_variable<std::allocator<char>_> local_1198;
  basic_variable<std::allocator<char>_> local_1168;
  basic_variable<std::allocator<char>_> local_1138;
  undefined1 local_1108 [24];
  basic_variable<std::allocator<char>_> expected_11;
  basic_variable<std::allocator<char>_> result_11;
  value_type input_11 [21];
  const_iterator local_1068;
  iterator local_1050;
  iterator local_1038;
  basic_variable<std::allocator<char>_> *local_1020;
  basic_variable<std::allocator<char>_> local_1018;
  basic_variable<std::allocator<char>_> local_fe8;
  basic_variable<std::allocator<char>_> local_fb8;
  undefined1 local_f88 [24];
  basic_variable<std::allocator<char>_> expected_10;
  basic_variable<std::allocator<char>_> result_10;
  value_type input_10 [17];
  const_iterator local_ee8;
  iterator local_ed0;
  iterator local_eb8;
  basic_variable<std::allocator<char>_> *local_ea0;
  basic_variable<std::allocator<char>_> local_e98;
  basic_variable<std::allocator<char>_> local_e68;
  basic_variable<std::allocator<char>_> local_e38;
  undefined1 local_e08 [24];
  basic_variable<std::allocator<char>_> expected_9;
  basic_variable<std::allocator<char>_> result_9;
  undefined7 local_d90;
  undefined1 uStack_d89;
  value_type input_9 [15];
  const_iterator local_d68;
  iterator local_d50;
  iterator local_d38;
  basic_variable<std::allocator<char>_> *local_d20;
  basic_variable<std::allocator<char>_> local_d18;
  basic_variable<std::allocator<char>_> local_ce8;
  basic_variable<std::allocator<char>_> local_cb8;
  undefined1 local_c88 [24];
  basic_variable<std::allocator<char>_> expected_8;
  basic_variable<std::allocator<char>_> result_8;
  undefined6 local_c10;
  undefined2 uStack_c0a;
  value_type input_8 [14];
  const_iterator local_be8;
  iterator local_bd0;
  iterator local_bb8;
  basic_variable<std::allocator<char>_> *local_ba0;
  basic_variable<std::allocator<char>_> local_b98;
  basic_variable<std::allocator<char>_> local_b68;
  basic_variable<std::allocator<char>_> local_b38;
  undefined1 local_b08 [24];
  basic_variable<std::allocator<char>_> expected_7;
  basic_variable<std::allocator<char>_> result_7;
  undefined7 local_a90;
  undefined1 uStack_a89;
  value_type input_7 [15];
  const_iterator local_a68;
  iterator local_a50;
  iterator local_a38;
  basic_variable<std::allocator<char>_> *local_a20;
  basic_variable<std::allocator<char>_> local_a18;
  basic_variable<std::allocator<char>_> local_9e8;
  basic_variable<std::allocator<char>_> local_9b8;
  undefined1 local_988 [24];
  basic_variable<std::allocator<char>_> expected_6;
  basic_variable<std::allocator<char>_> result_6;
  undefined7 uStack_910;
  undefined1 uStack_909;
  value_type input_6 [11];
  const_iterator local_8e8;
  iterator local_8d0;
  iterator local_8b8;
  basic_variable<std::allocator<char>_> *local_8a0;
  basic_variable<std::allocator<char>_> local_898;
  basic_variable<std::allocator<char>_> local_868;
  basic_variable<std::allocator<char>_> local_838;
  undefined1 local_808 [24];
  basic_variable<std::allocator<char>_> expected_5;
  basic_variable<std::allocator<char>_> result_5;
  undefined8 local_790;
  value_type input_5 [9];
  const_iterator local_768;
  iterator local_750;
  iterator local_738;
  basic_variable<std::allocator<char>_> *local_720;
  basic_variable<std::allocator<char>_> local_718;
  basic_variable<std::allocator<char>_> local_6e8;
  basic_variable<std::allocator<char>_> local_6b8;
  undefined1 local_688 [24];
  basic_variable<std::allocator<char>_> expected_4;
  basic_variable<std::allocator<char>_> result_4;
  undefined8 local_610;
  value_type input_4 [8];
  const_iterator local_600;
  const_iterator local_5e8;
  iterator local_5d0;
  iterator local_5b8;
  basic_variable<std::allocator<char>_> *local_5a0;
  basic_variable<std::allocator<char>_> local_598;
  basic_variable<std::allocator<char>_> local_568;
  basic_variable<std::allocator<char>_> local_538;
  undefined1 local_508 [24];
  basic_variable<std::allocator<char>_> expected_3;
  basic_variable<std::allocator<char>_> result_3;
  undefined8 local_490;
  value_type input_3 [12];
  const_iterator local_468;
  iterator local_450;
  iterator local_438;
  basic_variable<std::allocator<char>_> *local_420;
  basic_variable<std::allocator<char>_> local_418;
  basic_variable<std::allocator<char>_> local_3e8;
  basic_variable<std::allocator<char>_> local_3b8;
  undefined1 local_388 [24];
  basic_variable<std::allocator<char>_> expected_2;
  basic_variable<std::allocator<char>_> result_2;
  undefined8 local_310;
  value_type input_2 [8];
  const_iterator local_300;
  const_iterator local_2e8;
  iterator local_2d0;
  iterator local_2b8;
  basic_variable<std::allocator<char>_> *local_2a0;
  basic_variable<std::allocator<char>_> local_298;
  basic_variable<std::allocator<char>_> local_268;
  basic_variable<std::allocator<char>_> local_238;
  undefined1 local_208 [24];
  basic_variable<std::allocator<char>_> expected_1;
  basic_variable<std::allocator<char>_> result_1;
  value_type input_1 [6];
  const_iterator local_178;
  iterator local_160;
  iterator local_148;
  basic_variable<std::allocator<char>_> *local_130;
  basic_variable<std::allocator<char>_> local_128;
  basic_variable<std::allocator<char>_> local_f8;
  basic_variable<std::allocator<char>_> local_c8;
  undefined1 local_98 [24];
  basic_variable<std::allocator<char>_> expected;
  undefined1 local_48 [8];
  basic_variable<std::allocator<char>_> result;
  undefined4 local_10;
  undefined1 local_c;
  value_type input [5];
  
  local_c = 0x43;
  local_10 = 0x424103a8;
  trial::protocol::bintoken::parse<unsigned_char[5],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_48,(bintoken *)&local_10,in_RDX);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)local_48);
  pcVar3 = "void parser_suite::parse_compact_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0xa2,"void parser_suite::parse_compact_array()",bVar2);
  local_130 = &local_128;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_130,0x41);
  local_130 = &local_f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_130,0x42);
  local_130 = &local_c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_130,0x43);
  local_98._0_8_ = &local_128;
  local_98._8_8_ = 3;
  init._M_len = (size_type)pcVar3;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10),
             (basic_array<std::allocator<char>_> *)local_98._0_8_,init);
  local_1858 = (basic_variable<std::allocator<char>_> *)local_98;
  do {
    local_1858 = local_1858 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1858);
  } while (local_1858 != &local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_148,(basic_variable<std::allocator<char>_> *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_160,(basic_variable<std::allocator<char>_> *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_178,(basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)input_1,(basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0xa6,"void parser_suite::parse_compact_array()",&local_148,&local_160,&local_178,
             input_1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)input_1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_178)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_148);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  result_1.storage._44_2_ = 0x4342;
  result_1.storage._40_4_ = 0x410003b8;
  puVar1 = &expected_1.storage.field_0x28;
  trial::protocol::bintoken::parse<unsigned_char[6],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (bintoken *)&result_1.storage.field_0x28,input_16);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  pcVar3 = "void parser_suite::parse_compact_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0xb0,"void parser_suite::parse_compact_array()",bVar2);
  local_2a0 = &local_298;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2a0,0x41);
  local_2a0 = &local_268;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2a0,0x42);
  local_2a0 = &local_238;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2a0,0x43);
  local_208._0_8_ = &local_298;
  local_208._8_8_ = 3;
  init_00._M_len = (size_type)pcVar3;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_208 + 0x10),
             (basic_array<std::allocator<char>_> *)local_208._0_8_,init_00);
  local_1878 = (basic_variable<std::allocator<char>_> *)local_208;
  do {
    local_1878 = local_1878 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1878);
  } while (local_1878 != &local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2b8,(basic_variable<std::allocator<char>_> *)&expected_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2d0,(basic_variable<std::allocator<char>_> *)&expected_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2e8,(basic_variable<std::allocator<char>_> *)(local_208 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_300,(basic_variable<std::allocator<char>_> *)(local_208 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0xb4,"void parser_suite::parse_compact_array()",&local_2b8,&local_2d0,&local_2e8,
             &local_300);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_300)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_2e8)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_208 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expected_1.storage.field_0x28);
  local_310 = 0x43424100000003c8;
  puVar1 = &expected_2.storage.field_0x28;
  trial::protocol::bintoken::parse<unsigned_char[8],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)puVar1,(bintoken *)&local_310,input_17);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  pcVar3 = "void parser_suite::parse_compact_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0xbe,"void parser_suite::parse_compact_array()",bVar2);
  local_420 = &local_418;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_420,0x41);
  local_420 = &local_3e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_420,0x42);
  local_420 = &local_3b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_420,0x43);
  local_388._0_8_ = &local_418;
  local_388._8_8_ = 3;
  init_01._M_len = (size_type)pcVar3;
  init_01._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_388 + 0x10),
             (basic_array<std::allocator<char>_> *)local_388._0_8_,init_01);
  local_1898 = (basic_variable<std::allocator<char>_> *)local_388;
  do {
    local_1898 = local_1898 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1898);
  } while (local_1898 != &local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_438,(basic_variable<std::allocator<char>_> *)&expected_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_450,(basic_variable<std::allocator<char>_> *)&expected_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_468,(basic_variable<std::allocator<char>_> *)(local_388 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)(input_3 + 8),
             (basic_variable<std::allocator<char>_> *)(local_388 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0xc2,"void parser_suite::parse_compact_array()",&local_438,&local_450,&local_468,
             input_3 + 8);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(input_3 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_468)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_450);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_438);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_388 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expected_2.storage.field_0x28);
  input_3[0] = '\0';
  input_3[1] = 'A';
  input_3[2] = 'B';
  input_3[3] = 'C';
  local_490 = 0x3d8;
  puVar1 = &expected_3.storage.field_0x28;
  trial::protocol::bintoken::parse<unsigned_char[12],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)puVar1,(bintoken *)&local_490,input_18);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  pcVar3 = "void parser_suite::parse_compact_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0xcc,"void parser_suite::parse_compact_array()",bVar2);
  local_5a0 = &local_598;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_5a0,0x41);
  local_5a0 = &local_568;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_5a0,0x42);
  local_5a0 = &local_538;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_5a0,0x43);
  local_508._0_8_ = &local_598;
  local_508._8_8_ = 3;
  init_02._M_len = (size_type)pcVar3;
  init_02._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_508 + 0x10),
             (basic_array<std::allocator<char>_> *)local_508._0_8_,init_02);
  local_18b8 = (basic_variable<std::allocator<char>_> *)local_508;
  do {
    local_18b8 = local_18b8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_18b8);
  } while (local_18b8 != &local_598);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5b8,(basic_variable<std::allocator<char>_> *)&expected_3.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_5d0,(basic_variable<std::allocator<char>_> *)&expected_3.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5e8,(basic_variable<std::allocator<char>_> *)(local_508 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_600,(basic_variable<std::allocator<char>_> *)(local_508 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0xd0,"void parser_suite::parse_compact_array()",&local_5b8,&local_5d0,&local_5e8,
             &local_600);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_600)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_5e8)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_508 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expected_3.storage.field_0x28);
  local_610 = 0x430042004106aa;
  puVar1 = &expected_4.storage.field_0x28;
  trial::protocol::bintoken::parse<unsigned_char[8],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)puVar1,(bintoken *)&local_610,input_19);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  pcVar3 = "void parser_suite::parse_compact_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0xda,"void parser_suite::parse_compact_array()",bVar2);
  local_720 = &local_718;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_720,0x41);
  local_720 = &local_6e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_720,0x42);
  local_720 = &local_6b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_720,0x43);
  local_688._0_8_ = &local_718;
  local_688._8_8_ = 3;
  init_03._M_len = (size_type)pcVar3;
  init_03._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_688 + 0x10),
             (basic_array<std::allocator<char>_> *)local_688._0_8_,init_03);
  local_18d8 = (basic_variable<std::allocator<char>_> *)local_688;
  do {
    local_18d8 = local_18d8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_18d8);
  } while (local_18d8 != &local_718);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_738,(basic_variable<std::allocator<char>_> *)&expected_4.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_750,(basic_variable<std::allocator<char>_> *)&expected_4.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_768,(basic_variable<std::allocator<char>_> *)(local_688 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)(input_5 + 8),
             (basic_variable<std::allocator<char>_> *)(local_688 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0xde,"void parser_suite::parse_compact_array()",&local_738,&local_750,&local_768,
             input_5 + 8);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(input_5 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_768)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_750);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_738);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_688 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expected_4.storage.field_0x28);
  local_790 = 0x43004200410006ba;
  input_5[0] = '\0';
  puVar1 = &expected_5.storage.field_0x28;
  trial::protocol::bintoken::parse<unsigned_char[9],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)puVar1,(bintoken *)&local_790,input_20);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  pcVar3 = "void parser_suite::parse_compact_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0xe8,"void parser_suite::parse_compact_array()",bVar2);
  local_8a0 = &local_898;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_8a0,0x41);
  local_8a0 = &local_868;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_8a0,0x42);
  local_8a0 = &local_838;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_8a0,0x43);
  local_808._0_8_ = &local_898;
  local_808._8_8_ = 3;
  init_04._M_len = (size_type)pcVar3;
  init_04._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_808 + 0x10),
             (basic_array<std::allocator<char>_> *)local_808._0_8_,init_04);
  local_18f8 = (basic_variable<std::allocator<char>_> *)local_808;
  do {
    local_18f8 = local_18f8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_18f8);
  } while (local_18f8 != &local_898);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_8b8,(basic_variable<std::allocator<char>_> *)&expected_5.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_8d0,(basic_variable<std::allocator<char>_> *)&expected_5.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_8e8,(basic_variable<std::allocator<char>_> *)(local_808 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)(input_6 + 8),
             (basic_variable<std::allocator<char>_> *)(local_808 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0xec,"void parser_suite::parse_compact_array()",&local_8b8,&local_8d0,&local_8e8,
             input_6 + 8);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(input_6 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_8e8)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_808 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expected_5.storage.field_0x28);
  uStack_910 = 0x4100000006ca;
  _uStack_909 = 0x430042;
  puVar1 = &expected_6.storage.field_0x28;
  trial::protocol::bintoken::parse<unsigned_char[11],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)puVar1,(bintoken *)&uStack_910,input_21);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  pcVar3 = "void parser_suite::parse_compact_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0xf6,"void parser_suite::parse_compact_array()",bVar2);
  local_a20 = &local_a18;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a20,0x41);
  local_a20 = &local_9e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a20,0x42);
  local_a20 = &local_9b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a20,0x43);
  local_988._0_8_ = &local_a18;
  local_988._8_8_ = 3;
  init_05._M_len = (size_type)pcVar3;
  init_05._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_988 + 0x10),
             (basic_array<std::allocator<char>_> *)local_988._0_8_,init_05);
  local_1918 = (basic_variable<std::allocator<char>_> *)local_988;
  do {
    local_1918 = local_1918 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1918);
  } while (local_1918 != &local_a18);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_a38,(basic_variable<std::allocator<char>_> *)&expected_6.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_a50,(basic_variable<std::allocator<char>_> *)&expected_6.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_a68,(basic_variable<std::allocator<char>_> *)(local_988 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)(input_7 + 8),
             (basic_variable<std::allocator<char>_> *)(local_988 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0xfa,"void parser_suite::parse_compact_array()",&local_a38,&local_a50,&local_a68,
             input_7 + 8);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(input_7 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_a68)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a50);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a38);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_988 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expected_6.storage.field_0x28);
  input_7[0] = '\0';
  input_7[1] = 'A';
  input_7[2] = '\0';
  input_7[3] = 'B';
  input_7[4] = '\0';
  input_7[5] = 'C';
  input_7[6] = '\0';
  local_a90 = 0x6da;
  uStack_a89 = 0;
  puVar1 = &expected_7.storage.field_0x28;
  trial::protocol::bintoken::parse<unsigned_char[15],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)puVar1,(bintoken *)&local_a90,input_22);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  pcVar3 = "void parser_suite::parse_compact_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x104,"void parser_suite::parse_compact_array()",bVar2);
  local_ba0 = &local_b98;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_ba0,0x41);
  local_ba0 = &local_b68;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_ba0,0x42);
  local_ba0 = &local_b38;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_ba0,0x43);
  local_b08._0_8_ = &local_b98;
  local_b08._8_8_ = 3;
  init_06._M_len = (size_type)pcVar3;
  init_06._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_b08 + 0x10),
             (basic_array<std::allocator<char>_> *)local_b08._0_8_,init_06);
  local_1938 = (basic_variable<std::allocator<char>_> *)local_b08;
  do {
    local_1938 = local_1938 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1938);
  } while (local_1938 != &local_b98);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_bb8,(basic_variable<std::allocator<char>_> *)&expected_7.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_bd0,(basic_variable<std::allocator<char>_> *)&expected_7.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_be8,(basic_variable<std::allocator<char>_> *)(local_b08 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)(input_8 + 8),
             (basic_variable<std::allocator<char>_> *)(local_b08 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x108,"void parser_suite::parse_compact_array()",&local_bb8,&local_bd0,&local_be8,
             input_8 + 8);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(input_8 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_be8)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_bd0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_bb8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_b08 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expected_7.storage.field_0x28);
  input_8[0] = '\0';
  input_8[1] = '\0';
  input_8[2] = 'C';
  input_8[3] = '\0';
  input_8[4] = '\0';
  input_8[5] = '\0';
  local_c10 = 0x410cac;
  uStack_c0a = 0x42;
  puVar1 = &expected_8.storage.field_0x28;
  trial::protocol::bintoken::parse<unsigned_char[14],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)puVar1,(bintoken *)&local_c10,input_23);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  pcVar3 = "void parser_suite::parse_compact_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x112,"void parser_suite::parse_compact_array()",bVar2);
  local_d20 = &local_d18;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_d20,0x41);
  local_d20 = &local_ce8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_d20,0x42);
  local_d20 = &local_cb8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_d20,0x43);
  local_c88._0_8_ = &local_d18;
  local_c88._8_8_ = 3;
  init_07._M_len = (size_type)pcVar3;
  init_07._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_c88 + 0x10),
             (basic_array<std::allocator<char>_> *)local_c88._0_8_,init_07);
  local_1958 = (basic_variable<std::allocator<char>_> *)local_c88;
  do {
    local_1958 = local_1958 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1958);
  } while (local_1958 != &local_d18);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_d38,(basic_variable<std::allocator<char>_> *)&expected_8.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_d50,(basic_variable<std::allocator<char>_> *)&expected_8.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_d68,(basic_variable<std::allocator<char>_> *)(local_c88 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)(input_9 + 8),
             (basic_variable<std::allocator<char>_> *)(local_c88 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x116,"void parser_suite::parse_compact_array()",&local_d38,&local_d50,&local_d68,
             input_9 + 8);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(input_9 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_d68)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_d50);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_d38);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_c88 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expected_8.storage.field_0x28);
  input_9[0] = '\0';
  input_9[1] = '\0';
  input_9[2] = '\0';
  input_9[3] = 'C';
  input_9[4] = '\0';
  input_9[5] = '\0';
  input_9[6] = '\0';
  local_d90 = 0x41000cbc;
  uStack_d89 = 0x42;
  puVar1 = &expected_9.storage.field_0x28;
  trial::protocol::bintoken::parse<unsigned_char[15],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)puVar1,(bintoken *)&local_d90,input_24);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  pcVar3 = "void parser_suite::parse_compact_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x120,"void parser_suite::parse_compact_array()",bVar2);
  local_ea0 = &local_e98;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_ea0,0x41);
  local_ea0 = &local_e68;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_ea0,0x42);
  local_ea0 = &local_e38;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_ea0,0x43);
  local_e08._0_8_ = &local_e98;
  local_e08._8_8_ = 3;
  init_08._M_len = (size_type)pcVar3;
  init_08._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_e08 + 0x10),
             (basic_array<std::allocator<char>_> *)local_e08._0_8_,init_08);
  local_1978 = (basic_variable<std::allocator<char>_> *)local_e08;
  do {
    local_1978 = local_1978 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1978);
  } while (local_1978 != &local_e98);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_eb8,(basic_variable<std::allocator<char>_> *)&expected_9.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_ed0,(basic_variable<std::allocator<char>_> *)&expected_9.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_ee8,(basic_variable<std::allocator<char>_> *)(local_e08 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)(input_10 + 0x10),
             (basic_variable<std::allocator<char>_> *)(local_e08 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x124,"void parser_suite::parse_compact_array()",&local_eb8,&local_ed0,&local_ee8,
             input_10 + 0x10);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(input_10 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_ee8)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ed0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_eb8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_e08 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expected_9.storage.field_0x28);
  result_10.storage._40_8_ = 0x410000000ccc;
  input_10[0] = '\0';
  input_10[1] = 'B';
  input_10[2] = '\0';
  input_10[3] = '\0';
  input_10[4] = '\0';
  input_10[5] = 'C';
  input_10[6] = '\0';
  input_10[7] = '\0';
  input_10[8] = '\0';
  puVar1 = &expected_10.storage.field_0x28;
  trial::protocol::bintoken::parse<unsigned_char[17],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (bintoken *)&result_10.storage.field_0x28,input_25);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  pcVar3 = "void parser_suite::parse_compact_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x12e,"void parser_suite::parse_compact_array()",bVar2);
  local_1020 = &local_1018;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1020,0x41);
  local_1020 = &local_fe8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1020,0x42);
  local_1020 = &local_fb8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1020,0x43);
  local_f88._0_8_ = &local_1018;
  local_f88._8_8_ = 3;
  init_09._M_len = (size_type)pcVar3;
  init_09._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_f88 + 0x10),
             (basic_array<std::allocator<char>_> *)local_f88._0_8_,init_09);
  local_1998 = (basic_variable<std::allocator<char>_> *)local_f88;
  do {
    local_1998 = local_1998 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1998);
  } while (local_1998 != &local_1018);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1038,(basic_variable<std::allocator<char>_> *)&expected_10.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1050,(basic_variable<std::allocator<char>_> *)&expected_10.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1068,(basic_variable<std::allocator<char>_> *)(local_f88 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)(input_11 + 0x10),
             (basic_variable<std::allocator<char>_> *)(local_f88 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x132,"void parser_suite::parse_compact_array()",&local_1038,&local_1050,&local_1068,
             input_11 + 0x10);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(input_11 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            (&local_1068);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1050);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1038);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_f88 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expected_10.storage.field_0x28);
  input_11[8] = '\0';
  input_11[9] = 'C';
  input_11[10] = '\0';
  input_11[0xb] = '\0';
  input_11[0xc] = '\0';
  result_11.storage._40_8_ = 0xcdc;
  input_11[0] = '\0';
  input_11[1] = 'A';
  input_11[2] = '\0';
  input_11[3] = '\0';
  input_11[4] = '\0';
  input_11[5] = 'B';
  input_11[6] = '\0';
  input_11[7] = '\0';
  puVar1 = &expected_11.storage.field_0x28;
  trial::protocol::bintoken::parse<unsigned_char[21],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (bintoken *)&result_11.storage.field_0x28,input_26);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  pcVar3 = "void parser_suite::parse_compact_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x13c,"void parser_suite::parse_compact_array()",bVar2);
  local_11a0 = &local_1198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_11a0,0x41);
  local_11a0 = &local_1168;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_11a0,0x42);
  local_11a0 = &local_1138;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_11a0,0x43);
  local_1108._0_8_ = &local_1198;
  local_1108._8_8_ = 3;
  init_10._M_len = (size_type)pcVar3;
  init_10._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1108 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1108._0_8_,init_10);
  local_19b8 = (basic_variable<std::allocator<char>_> *)local_1108;
  do {
    local_19b8 = local_19b8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_19b8);
  } while (local_19b8 != &local_1198);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_11b8,(basic_variable<std::allocator<char>_> *)&expected_11.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_11d0,(basic_variable<std::allocator<char>_> *)&expected_11.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_11e8,(basic_variable<std::allocator<char>_> *)(local_1108 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1200,(basic_variable<std::allocator<char>_> *)(local_1108 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x140,"void parser_suite::parse_compact_array()",&local_11b8,&local_11d0,&local_11e8,
             &local_1200);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            (&local_1200);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            (&local_11e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_11d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_11b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1108 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expected_11.storage.field_0x28);
  result_12.storage._40_8_ = 0x4118ae;
  puVar1 = &expected_12.storage.field_0x28;
  trial::protocol::bintoken::parse<unsigned_char[26],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (bintoken *)&result_12.storage.field_0x28,input_27);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  pcVar3 = "void parser_suite::parse_compact_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x14a,"void parser_suite::parse_compact_array()",bVar2);
  local_1330 = &local_1328;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1330,0x41);
  local_1330 = &local_12f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1330,0x42);
  local_1330 = &local_12c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1330,0x43);
  local_1298._0_8_ = &local_1328;
  local_1298._8_8_ = 3;
  init_11._M_len = (size_type)pcVar3;
  init_11._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1298 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1298._0_8_,init_11);
  local_19d8 = (basic_variable<std::allocator<char>_> *)local_1298;
  do {
    local_19d8 = local_19d8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_19d8);
  } while (local_19d8 != &local_1328);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1348,(basic_variable<std::allocator<char>_> *)&expected_12.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1360,(basic_variable<std::allocator<char>_> *)&expected_12.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1378,(basic_variable<std::allocator<char>_> *)(local_1298 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1390,(basic_variable<std::allocator<char>_> *)(local_1298 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x14e,"void parser_suite::parse_compact_array()",&local_1348,&local_1360,&local_1378,
             &local_1390);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            (&local_1390);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            (&local_1378);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1360);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1348);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1298 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expected_12.storage.field_0x28);
  result_13.storage._40_8_ = 0x410018be;
  puVar1 = &expected_13.storage.field_0x28;
  trial::protocol::bintoken::parse<unsigned_char[27],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (bintoken *)&result_13.storage.field_0x28,input_28);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  pcVar3 = "void parser_suite::parse_compact_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x158,"void parser_suite::parse_compact_array()",bVar2);
  local_14c0 = &local_14b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_14c0,0x41);
  local_14c0 = &local_1488;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_14c0,0x42);
  local_14c0 = &local_1458;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_14c0,0x43);
  local_1428._0_8_ = &local_14b8;
  local_1428._8_8_ = 3;
  init_12._M_len = (size_type)pcVar3;
  init_12._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1428 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1428._0_8_,init_12);
  local_19f8 = (basic_variable<std::allocator<char>_> *)local_1428;
  do {
    local_19f8 = local_19f8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_19f8);
  } while (local_19f8 != &local_14b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_14d8,(basic_variable<std::allocator<char>_> *)&expected_13.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_14f0,(basic_variable<std::allocator<char>_> *)&expected_13.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1508,(basic_variable<std::allocator<char>_> *)(local_1428 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1520,(basic_variable<std::allocator<char>_> *)(local_1428 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x15c,"void parser_suite::parse_compact_array()",&local_14d8,&local_14f0,&local_1508,
             &local_1520);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            (&local_1520);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            (&local_1508);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_14f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_14d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1428 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expected_13.storage.field_0x28);
  result_14.storage._40_8_ = 0x4100000018ce;
  puVar1 = &expected_14.storage.field_0x28;
  trial::protocol::bintoken::parse<unsigned_char[29],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (bintoken *)&result_14.storage.field_0x28,input_29);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  pcVar3 = "void parser_suite::parse_compact_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x166,"void parser_suite::parse_compact_array()",bVar2);
  local_1650 = &local_1648;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1650,0x41);
  local_1650 = &local_1618;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1650,0x42);
  local_1650 = &local_15e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1650,0x43);
  local_15b8._0_8_ = &local_1648;
  local_15b8._8_8_ = 3;
  init_13._M_len = (size_type)pcVar3;
  init_13._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_15b8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_15b8._0_8_,init_13);
  local_1a18 = (basic_variable<std::allocator<char>_> *)local_15b8;
  do {
    local_1a18 = local_1a18 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1a18);
  } while (local_1a18 != &local_1648);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1668,(basic_variable<std::allocator<char>_> *)&expected_14.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1680,(basic_variable<std::allocator<char>_> *)&expected_14.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1698,(basic_variable<std::allocator<char>_> *)(local_15b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)(input_15 + 0x20),
             (basic_variable<std::allocator<char>_> *)(local_15b8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x16a,"void parser_suite::parse_compact_array()",&local_1668,&local_1680,&local_1698,
             input_15 + 0x20);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(input_15 + 0x20));
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            (&local_1698);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1680);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1668);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_15b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expected_14.storage.field_0x28);
  input_15[0x18] = '\0';
  result_15.storage._40_8_ = 0x18de;
  input_15[0] = '\0';
  input_15[1] = 'A';
  input_15[2] = '\0';
  input_15[3] = '\0';
  input_15[4] = '\0';
  input_15[5] = '\0';
  input_15[6] = '\0';
  input_15[7] = '\0';
  input_15[8] = '\0';
  input_15[9] = 'B';
  input_15[10] = '\0';
  input_15[0xb] = '\0';
  input_15[0xc] = '\0';
  input_15[0xd] = '\0';
  input_15[0xe] = '\0';
  input_15[0xf] = '\0';
  input_15[0x10] = '\0';
  input_15[0x11] = 'C';
  input_15[0x12] = '\0';
  input_15[0x13] = '\0';
  input_15[0x14] = '\0';
  input_15[0x15] = '\0';
  input_15[0x16] = '\0';
  input_15[0x17] = '\0';
  puVar1 = &expected_15.storage.field_0x28;
  trial::protocol::bintoken::parse<unsigned_char[33],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (bintoken *)&result_15.storage.field_0x28,input_30);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  pcVar3 = "void parser_suite::parse_compact_array()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x174,"void parser_suite::parse_compact_array()",bVar2);
  local_17e0 = &local_17d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_17e0,0x41);
  local_17e0 = &local_17a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_17e0,0x42);
  local_17e0 = &local_1778;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_17e0,0x43);
  local_1748._0_8_ = &local_17d8;
  local_1748._8_8_ = 3;
  init_14._M_len = (size_type)pcVar3;
  init_14._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1748 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1748._0_8_,init_14);
  local_1a38 = (basic_variable<std::allocator<char>_> *)local_1748;
  do {
    local_1a38 = local_1a38 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1a38);
  } while (local_1a38 != &local_17d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_17f8,(basic_variable<std::allocator<char>_> *)&expected_15.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1810,(basic_variable<std::allocator<char>_> *)&expected_15.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1828,(basic_variable<std::allocator<char>_> *)(local_1748 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1840,(basic_variable<std::allocator<char>_> *)(local_1748 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x178,"void parser_suite::parse_compact_array()",&local_17f8,&local_1810,&local_1828,
             &local_1840);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            (&local_1840);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            (&local_1828);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1810);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_17f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1748 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expected_15.storage.field_0x28);
  return;
}

Assistant:

void parse_compact_array()
{
    // array8_int8
    {
        const value_type input[] = {
            bintoken::token::code::array8_int8, 3 * bintoken::token::int8::size,
            0x41,
            0x42,
            0x43 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ 0x41, 0x42, 0x43 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
    // array16_int8
    {
        const value_type input[] = {
            bintoken::token::code::array16_int8, 3 * bintoken::token::int8::size, 0x00,
            0x41,
            0x42,
            0x43 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ 0x41, 0x42, 0x43 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
    // array32_int8
    {
        const value_type input[] = {
            bintoken::token::code::array32_int8, 3 * bintoken::token::int8::size, 0x00, 0x00, 0x00,
            0x41,
            0x42,
            0x43 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ 0x41, 0x42, 0x43 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
    // array64_int8
    {
        const value_type input[] = {
            bintoken::token::code::array64_int8, 3 * bintoken::token::int8::size, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x41,
            0x42,
            0x43 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ 0x41, 0x42, 0x43 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
    // array8_int16
    {
        const value_type input[] = {
            bintoken::token::code::array8_int16, 3 * bintoken::token::int16::size,
            0x41, 0x00,
            0x42, 0x00,
            0x43, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ 0x41, 0x42, 0x43 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
    // array16_int16
    {
        const value_type input[] = {
            bintoken::token::code::array16_int16, 3 * bintoken::token::int16::size, 0x00,
            0x41, 0x00,
            0x42, 0x00,
            0x43, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ 0x41, 0x42, 0x43 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
    // array32_int16
    {
        const value_type input[] = {
            bintoken::token::code::array32_int16, 3 * bintoken::token::int16::size, 0x00, 0x00, 0x00,
            0x41, 0x00,
            0x42, 0x00,
            0x43, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ 0x41, 0x42, 0x43 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
    // array64_int16
    {
        const value_type input[] = {
            bintoken::token::code::array64_int16, 3 * bintoken::token::int16::size, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x41, 0x00,
            0x42, 0x00,
            0x43, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ 0x41, 0x42, 0x43 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
    // array8_int32
    {
        const value_type input[] = {
            bintoken::token::code::array8_int32, 3 * bintoken::token::int32::size,
            0x41, 0x00, 0x00, 0x00,
            0x42, 0x00, 0x00, 0x00,
            0x43, 0x00, 0x00, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ 0x41, 0x42, 0x43 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
    // array16_int32
    {
        const value_type input[] = {
            bintoken::token::code::array16_int32, 3 * bintoken::token::int32::size, 0x00,
            0x41, 0x00, 0x00, 0x00,
            0x42, 0x00, 0x00, 0x00,
            0x43, 0x00, 0x00, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ 0x41, 0x42, 0x43 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
    // array32_int32
    {
        const value_type input[] = {
            bintoken::token::code::array32_int32, 3 * bintoken::token::int32::size, 0x00, 0x00, 0x00,
            0x41, 0x00, 0x00, 0x00,
            0x42, 0x00, 0x00, 0x00,
            0x43, 0x00, 0x00, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ 0x41, 0x42, 0x43 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
    // array64_int32
    {
        const value_type input[] = {
            bintoken::token::code::array64_int32, 3 * bintoken::token::int32::size, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x41, 0x00, 0x00, 0x00,
            0x42, 0x00, 0x00, 0x00,
            0x43, 0x00, 0x00, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ 0x41, 0x42, 0x43 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
    // array8_int64
    {
        const value_type input[] = {
            bintoken::token::code::array8_int64, 3 * bintoken::token::int64::size,
            0x41, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x42, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x43, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ 0x41, 0x42, 0x43 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
    // array16_int64
    {
        const value_type input[] = {
            bintoken::token::code::array16_int64, 3 * bintoken::token::int64::size, 0x00,
            0x41, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x42, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x43, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ 0x41, 0x42, 0x43 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
    // array32_int64
    {
        const value_type input[] = {
            bintoken::token::code::array32_int64, 3 * bintoken::token::int64::size, 0x00, 0x00, 0x00,
            0x41, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x42, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x43, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ 0x41, 0x42, 0x43 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
    // array64_int64
    {
        const value_type input[] = {
            bintoken::token::code::array64_int64, 3 * bintoken::token::int64::size, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x41, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x42, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x43, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ 0x41, 0x42, 0x43 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
}